

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

int __thiscall
google::protobuf::internal::ExtensionSet::GetEnum(ExtensionSet *this,int number,int default_value)

{
  Extension *pEVar1;
  
  pEVar1 = FindOrNull(this,number);
  if ((pEVar1 == (Extension *)0x0) || ((pEVar1->field_0xa & 2) != 0)) {
    return default_value;
  }
  if (pEVar1->is_repeated == false) {
    if (0xed < (byte)(pEVar1->type - 0x13)) {
      if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)pEVar1->type * 4) == 8) {
        return (pEVar1->field_0).int32_t_value;
      }
      goto LAB_003fc39e;
    }
  }
  else {
    GetEnum();
  }
  GetEnum();
LAB_003fc39e:
  GetEnum();
}

Assistant:

int ExtensionSet::GetEnum(int number, int default_value) const {
  const Extension* extension = FindOrNull(number);
  if (extension == nullptr || extension->is_cleared) {
    // Not present.  Return the default value.
    return default_value;
  } else {
    ABSL_DCHECK_TYPE(*extension, OPTIONAL_FIELD, ENUM);
    return extension->enum_value;
  }
}